

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void CTcSymLocal::s_gen_code_getlcl(int var_num,int is_param)

{
  size_t __n;
  void *__buf;
  int in_ESI;
  uint in_EDI;
  uchar in_stack_000000ef;
  CTcGenTarg *in_stack_000000f0;
  
  if ((in_ESI == 0) || (3 < (int)in_EDI)) {
    if ((in_ESI == 0) && ((int)in_EDI < 6)) {
      CTcGenTarg::write_op(in_stack_000000f0,in_stack_000000ef);
    }
    else if ((int)in_EDI < 0x100) {
      __n = 0x82;
      CTcGenTarg::write_op(in_stack_000000f0,in_stack_000000ef);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)in_EDI,__buf,__n);
    }
    else {
      CTcGenTarg::write_op(in_stack_000000f0,in_stack_000000ef);
      CTcDataStream::write2((CTcDataStream *)CONCAT44(var_num,is_param),in_EDI);
    }
  }
  else {
    CTcGenTarg::write_op(in_stack_000000f0,in_stack_000000ef);
  }
  CTcGenTarg::note_push((CTcGenTarg *)0x2d7df2);
  return;
}

Assistant:

void CTcSymLocal::s_gen_code_getlcl(int var_num, int is_param)
{
    /* use the shortest form of the instruction that we can */
    if (is_param && var_num < 4)
    {
        /* arguments 0-3 have dedicated opcodes */
        G_cg->write_op(OPC_GETARGN0 + var_num);
    }
    else if (!is_param && var_num < 6)
    {
        /* locals 0-5 have dedicated opcodes */
        G_cg->write_op(OPC_GETLCLN0 + var_num);
    }
    else if (var_num <= 255)
    {
        /* 8-bit local number - use the one-byte form */
        G_cg->write_op(is_param ? OPC_GETARG1 : OPC_GETLCL1);
        G_cs->write((char)var_num);
    }
    else
    {
        /* local number won't fit in 8 bits - use the two-byte form */
        G_cg->write_op(is_param ? OPC_GETARG2 : OPC_GETLCL2);
        G_cs->write2(var_num);
    }

    /* note the push */
    G_cg->note_push();
}